

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

qpdf_offset_t __thiscall
QPDFWriter::writeXRefTable
          (QPDFWriter *this,trailer_e which,int first,int last,int size,qpdf_offset_t prev,
          bool suppress_offsets,int hint_id,qpdf_offset_t hint_offset,qpdf_offset_t hint_length,
          int linearization_pass)

{
  element_type *peVar1;
  NewObject *this_00;
  ulong uVar2;
  string_view str;
  string_view local_148;
  string_view local_138;
  string local_128;
  string_view local_108;
  QUtil *local_f8;
  qpdf_offset_t offset;
  int local_dc;
  undefined1 auStack_d8 [4];
  int i;
  qpdf_offset_t local_c8;
  qpdf_offset_t space_before_zero;
  string_view local_a0;
  string_view local_90 [2];
  string local_70;
  string_view local_50;
  string_view local_40;
  byte local_29;
  qpdf_offset_t qStack_28;
  bool suppress_offsets_local;
  qpdf_offset_t prev_local;
  int size_local;
  int last_local;
  int first_local;
  trailer_e which_local;
  QPDFWriter *this_local;
  
  uVar2 = (ulong)(uint)last;
  local_29 = suppress_offsets;
  qStack_28 = prev;
  prev_local._0_4_ = size;
  prev_local._4_4_ = last;
  size_local = first;
  last_local = which;
  _first_local = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"xref\n");
  writeString(this,local_40);
  std::__cxx11::to_string(&local_70,size_local);
  local_50 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_70);
  writeString(this,local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_90," ");
  writeString(this,local_90[0]);
  std::__cxx11::to_string((string *)&space_before_zero,(prev_local._4_4_ - size_local) + 1);
  local_a0 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&space_before_zero);
  writeString(this,local_a0);
  std::__cxx11::string::~string((string *)&space_before_zero);
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_c8 = ::qpdf::pl::Count::getCount(peVar1->pipeline);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_d8,"\n");
  writeString(this,_auStack_d8);
  for (local_dc = size_local; local_dc <= prev_local._4_4_; local_dc = local_dc + 1) {
    if (local_dc == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&offset,"0000000000 65535 f \n"
                );
      writeString(this,_offset);
    }
    else {
      local_f8 = (QUtil *)0x0;
      if ((local_29 & 1) == 0) {
        peVar1 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        this_00 = ObjTable<QPDFWriter::NewObject>::operator[]
                            (&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>,local_dc);
        local_f8 = (QUtil *)QPDFXRefEntry::getOffset(&this_00->xref);
        if (((hint_id != 0) && (local_dc != hint_id)) && (hint_offset <= (long)local_f8)) {
          local_f8 = local_f8 + hint_length;
        }
      }
      QUtil::int_to_string_abi_cxx11_(&local_128,local_f8,10,(int)uVar2);
      str = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_128);
      local_108 = str;
      writeString(this,str);
      std::__cxx11::string::~string((string *)&local_128);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_138," 00000 n \n");
      writeString(this,local_138);
    }
  }
  writeTrailer(this,last_local,(int)prev_local,false,qStack_28,linearization_pass);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"\n");
  writeString(this,local_148);
  return local_c8;
}

Assistant:

qpdf_offset_t
QPDFWriter::writeXRefTable(
    trailer_e which,
    int first,
    int last,
    int size,
    qpdf_offset_t prev,
    bool suppress_offsets,
    int hint_id,
    qpdf_offset_t hint_offset,
    qpdf_offset_t hint_length,
    int linearization_pass)
{
    writeString("xref\n");
    writeString(std::to_string(first));
    writeString(" ");
    writeString(std::to_string(last - first + 1));
    qpdf_offset_t space_before_zero = m->pipeline->getCount();
    writeString("\n");
    for (int i = first; i <= last; ++i) {
        if (i == 0) {
            writeString("0000000000 65535 f \n");
        } else {
            qpdf_offset_t offset = 0;
            if (!suppress_offsets) {
                offset = m->new_obj[i].xref.getOffset();
                if ((hint_id != 0) && (i != hint_id) && (offset >= hint_offset)) {
                    offset += hint_length;
                }
            }
            writeString(QUtil::int_to_string(offset, 10));
            writeString(" 00000 n \n");
        }
    }
    writeTrailer(which, size, false, prev, linearization_pass);
    writeString("\n");
    return space_before_zero;
}